

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parsing::File::getContent_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,File *this)

{
  char cVar1;
  istream *piVar2;
  string tmp;
  fstream f;
  value_type local_250;
  long local_230 [4];
  byte abStack_210 [496];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream((istream *)local_230,(string *)&this->_path,_S_out|_S_in);
  if (((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) &&
     ((this->_path)._M_string_length != 0)) {
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) +
                              (char)(istream *)local_230);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_230,(string *)&local_250,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_250);
    }
    std::fstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                               local_250.field_2._M_local_buf[0]) + 1);
    }
  }
  std::fstream::~fstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> File::getContent() const
    {
        std::vector<std::string> cont;
        std::fstream f(_path);
        if (!f || _path.empty())
            return cont;

        std::string tmp;
        while(std::getline(f, tmp))
            cont.push_back(tmp);
        f.close();
        return cont;
    }